

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_member_in_struct
          (CompilerHLSL *this,SPIRVariable *var,uint32_t member_index,uint32_t location,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  TypedID *this_00;
  Bitset *pBVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  value_type local_28c;
  uint local_288;
  uint local_284;
  uint32_t i;
  uint32_t consumed_locations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  uint32_t local_23c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  SPIRType *local_218;
  SPIRType *mbr_type;
  spirv_cross local_1f0 [32];
  undefined1 local_1d0 [8];
  string mbr_name;
  undefined1 local_1a0 [8];
  string semantic;
  SPIRType type;
  SPIREntryPoint *execution;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *active_locations_local;
  uint32_t location_local;
  uint32_t member_index_local;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get_entry_point((Compiler *)this);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
  SPIRType::SPIRType((SPIRType *)((long)&semantic.field_2 + 8),pSVar2);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
  to_semantic_abi_cxx11_
            ((string *)local_1a0,this,location,
             *(ExecutionModel *)&type.member_name_cache._M_h._M_single_bucket[0x1d]._M_nxt,
             var->storage);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_1f0,this,(ulong)uVar1,1);
  CompilerGLSL::to_member_name_abi_cxx11_
            ((string *)&mbr_type,&this->super_CompilerGLSL,(SPIRType *)((long)&semantic.field_2 + 8)
             ,member_index);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            ((string *)local_1d0,local_1f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66305e,
             (char (*) [2])&mbr_type,ts_2);
  ::std::__cxx11::string::~string((string *)&mbr_type);
  ::std::__cxx11::string::~string((string *)local_1f0);
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)&type.storage,
                       (ulong)member_index);
  uVar1 = TypedID::operator_cast_to_unsigned_int(this_00);
  local_218 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
  local_23c = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&type);
  pBVar3 = Compiler::get_member_decoration_bitset((Compiler *)this,(TypeID)local_23c,member_index);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x35])(&local_238,this,pBVar3);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_260,this,local_218,0);
  pSVar2 = local_218;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&i,this,pSVar2,(ulong)uVar1);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,&local_238,&local_260,(char (*) [2])0x645fd9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
             (char (*) [4])0x68bfe3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
             (char (*) [2])0x6815db);
  ::std::__cxx11::string::~string((string *)&i);
  ::std::__cxx11::string::~string((string *)&local_260);
  ::std::__cxx11::string::~string((string *)&local_238);
  local_284 = type_to_consumed_locations(this,local_218);
  for (local_288 = 0; local_288 < local_284; local_288 = local_288 + 1) {
    local_28c = location + local_288;
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(active_locations,&local_28c);
  }
  ::std::__cxx11::string::~string((string *)local_1d0);
  ::std::__cxx11::string::~string((string *)local_1a0);
  SPIRType::~SPIRType((SPIRType *)((long)&semantic.field_2 + 8));
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_member_in_struct(const SPIRVariable &var, uint32_t member_index,
                                                         uint32_t location,
                                                         std::unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);
	auto semantic = to_semantic(location, execution.model, var.storage);
	auto mbr_name = join(to_name(type.self), "_", to_member_name(type, member_index));
	auto &mbr_type = get<SPIRType>(type.member_types[member_index]);

	statement(to_interpolation_qualifiers(get_member_decoration_bitset(type.self, member_index)),
	          type_to_glsl(mbr_type),
	          " ", mbr_name, type_to_array_glsl(mbr_type, var.self),
	          " : ", semantic, ";");

	// Structs and arrays should consume more locations.
	uint32_t consumed_locations = type_to_consumed_locations(mbr_type);
	for (uint32_t i = 0; i < consumed_locations; i++)
		active_locations.insert(location + i);
}